

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

uint64_t __thiscall
mkvmuxer::ContentEncoding::EncodingSize
          (ContentEncoding *this,uint64_t compression_size,uint64_t encryption_size)

{
  uint64 uVar1;
  uint64 uVar2;
  uint64 uVar3;
  long lVar4;
  
  if (compression_size != 0) {
    return 0;
  }
  if (encryption_size == 0) {
    lVar4 = 0;
  }
  else {
    uVar1 = EbmlMasterElementSize(0x5035,encryption_size);
    lVar4 = uVar1 + encryption_size;
  }
  uVar1 = EbmlElementSize(0x5033,this->encoding_type_);
  uVar2 = EbmlElementSize(0x5032,this->encoding_scope_);
  uVar3 = EbmlElementSize(0x5031,this->encoding_order_);
  return uVar3 + uVar2 + uVar1 + lVar4;
}

Assistant:

uint64_t ContentEncoding::EncodingSize(uint64_t compression_size,
                                       uint64_t encryption_size) const {
  // TODO(fgalligan): Add support for compression settings.
  if (compression_size != 0)
    return 0;

  uint64_t encoding_size = 0;

  if (encryption_size > 0) {
    encoding_size +=
        EbmlMasterElementSize(libwebm::kMkvContentEncryption, encryption_size) +
        encryption_size;
  }
  encoding_size += EbmlElementSize(libwebm::kMkvContentEncodingType,
                                   static_cast<uint64>(encoding_type_));
  encoding_size += EbmlElementSize(libwebm::kMkvContentEncodingScope,
                                   static_cast<uint64>(encoding_scope_));
  encoding_size += EbmlElementSize(libwebm::kMkvContentEncodingOrder,
                                   static_cast<uint64>(encoding_order_));

  return encoding_size;
}